

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void gl4cts::FunctionObject::pack<tcu::Matrix<double,_3,_2>_>::set
               (GLvoid *buffer,Matrix<double,_3,_2> *in)

{
  GLint column;
  long lVar1;
  GLint row;
  long lVar2;
  GLdouble *data;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      *(double *)((long)buffer + lVar2 * 8) =
           ((Vector<tcu::Vector<double,_3>,_2> *)((Vector<double,_3> *)in)->m_data)->m_data[0].
           m_data[lVar2];
    }
    buffer = (GLvoid *)((long)buffer + 0x18);
    in = (Matrix<double,_3,_2> *)((long)in + 0x18);
  }
  return;
}

Assistant:

static void set(glw::GLvoid* buffer, const tcu::Matrix<glw::GLdouble, Rows, Cols>& in)
	{
		glw::GLdouble* data = (glw::GLdouble*)buffer;

		for (glw::GLint column = 0; column < Cols; ++column)
		{
			for (glw::GLint row = 0; row < Rows; ++row)
			{
				glw::GLint index = column * Rows + row;

				data[index] = in(row, column);
			}
		}
	}